

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float128 subFloat128Sigs(float128 a,float128 b,flag zSign,float_status *status)

{
  float128 a_00;
  float128 a_01;
  float128 b_00;
  float128 b_01;
  float128 b_02;
  float128 a_02;
  float128 a_03;
  float128 a_04;
  float128 a_05;
  float128 a_06;
  int zExp_00;
  float128 fVar1;
  int local_8c;
  uint64_t uStack_88;
  int32_t expDiff;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig1;
  uint64_t aSig0;
  int local_50;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  float_status *status_local;
  uint64_t uStack_38;
  flag zSign_local;
  float128 b_local;
  float128 a_local;
  uint64_t local_10;
  
  b_local.low = b.high;
  uStack_38 = b.low;
  local_10 = a.high;
  b_local.high = a.low;
  _bExp = status;
  status_local._7_1_ = zSign;
  bSig0 = extractFloat128Frac1(a);
  a_02.high = local_10;
  a_02.low = b_local.high;
  aSig1 = extractFloat128Frac0(a_02);
  a_03.high = local_10;
  a_03.low = b_local.high;
  zExp = extractFloat128Exp(a_03);
  fVar1.high = b_local.low;
  fVar1.low = uStack_38;
  zSig0 = extractFloat128Frac1(fVar1);
  a_00.high = b_local.low;
  a_00.low = uStack_38;
  bSig1 = extractFloat128Frac0(a_00);
  a_01.high = b_local.low;
  a_01.low = uStack_38;
  local_50 = extractFloat128Exp(a_01);
  local_8c = zExp - local_50;
  shortShift128Left(aSig1,bSig0,0xe,&aSig1,&bSig0);
  shortShift128Left(bSig1,zSig0,0xe,&bSig1,&zSig0);
  if (local_8c < 1) {
    if (local_8c < 0) {
      if (local_50 == 0x7fff) {
        if (bSig1 != 0 || zSig0 != 0) {
          a_05.high = local_10;
          a_05.low = b_local.high;
          b_01.high = b_local.low;
          b_01.low = uStack_38;
          fVar1 = propagateFloat128NaN(a_05,b_01,_bExp);
          return fVar1;
        }
        fVar1 = packFloat128(status_local._7_1_ ^ 1,0x7fff,0,0);
        return fVar1;
      }
      if (zExp == 0) {
        local_8c = local_8c + 1;
      }
      else {
        aSig1 = aSig1 | 0x4000000000000000;
      }
      shift128RightJamming(aSig1,bSig0,-local_8c,&aSig1,&bSig0);
      bSig1 = bSig1 | 0x4000000000000000;
    }
    else {
      if (zExp == 0x7fff) {
        if (((aSig1 != 0 || bSig0 != 0) || bSig1 != 0) || zSig0 != 0) {
          a_04.high = local_10;
          a_04.low = b_local.high;
          b_00.high = b_local.low;
          b_00.low = uStack_38;
          fVar1 = propagateFloat128NaN(a_04,b_00,_bExp);
          return fVar1;
        }
        float_raise_tricore('\x01',_bExp);
        fVar1 = float128_default_nan_tricore(_bExp);
        return fVar1;
      }
      if (zExp == 0) {
        zExp = 1;
        local_50 = 1;
      }
      if (bSig1 < aSig1) goto LAB_012cace3;
      if (bSig1 <= aSig1) {
        if (zSig0 < bSig0) goto LAB_012cace3;
        if (zSig0 <= bSig0) {
          fVar1 = packFloat128(_bExp->float_rounding_mode == '\x01',0,0,0);
          return fVar1;
        }
      }
    }
    sub128(bSig1,zSig0,aSig1,bSig0,&zSig1,&stack0xffffffffffffff78);
    aSig0._4_4_ = local_50;
    status_local._7_1_ = status_local._7_1_ ^ 1;
  }
  else {
    if (zExp == 0x7fff) {
      if (aSig1 != 0 || bSig0 != 0) {
        a_06.high = local_10;
        a_06.low = b_local.high;
        b_02.high = b_local.low;
        b_02.low = uStack_38;
        fVar1 = propagateFloat128NaN(a_06,b_02,_bExp);
        return fVar1;
      }
      a_local.high = b_local.high;
      return stack0xffffffffffffffe8;
    }
    if (local_50 == 0) {
      local_8c = local_8c + -1;
    }
    else {
      bSig1 = bSig1 | 0x4000000000000000;
    }
    shift128RightJamming(bSig1,zSig0,local_8c,&bSig1,&zSig0);
    aSig1 = aSig1 | 0x4000000000000000;
LAB_012cace3:
    sub128(aSig1,bSig0,bSig1,zSig0,&zSig1,&stack0xffffffffffffff78);
    aSig0._4_4_ = zExp;
  }
  zExp_00 = aSig0._4_4_ + -0xf;
  aSig0._4_4_ = aSig0._4_4_ + -1;
  fVar1 = normalizeRoundAndPackFloat128(status_local._7_1_,zExp_00,zSig1,uStack_88,_bExp);
  return fVar1;
}

Assistant:

static float128 subFloat128Sigs(float128 a, float128 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1;
    int32_t expDiff;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    expDiff = aExp - bExp;
    shortShift128Left( aSig0, aSig1, 14, &aSig0, &aSig1 );
    shortShift128Left( bSig0, bSig1, 14, &bSig0, &bSig1 );
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 | bSig0 | bSig1 ) {
            return propagateFloat128NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    if ( bSig0 < aSig0 ) goto aBigger;
    if ( aSig0 < bSig0 ) goto bBigger;
    if ( bSig1 < aSig1 ) goto aBigger;
    if ( aSig1 < bSig1 ) goto bBigger;
    return packFloat128(status->float_rounding_mode == float_round_down,
                        0, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign ^ 1, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        ++expDiff;
    }
    else {
        aSig0 |= UINT64_C(0x4000000000000000);
    }
    shift128RightJamming( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
    bSig0 |= UINT64_C(0x4000000000000000);
 bBigger:
    sub128( bSig0, bSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        --expDiff;
    }
    else {
        bSig0 |= UINT64_C(0x4000000000000000);
    }
    shift128RightJamming( bSig0, bSig1, expDiff, &bSig0, &bSig1 );
    aSig0 |= UINT64_C(0x4000000000000000);
 aBigger:
    sub128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    --zExp;
    return normalizeRoundAndPackFloat128(zSign, zExp - 14, zSig0, zSig1,
                                         status);

}